

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cc
# Opt level: O0

Status __thiscall
leveldb::BuildTable(leveldb *this,string *dbname,Env *env,Options *options,TableCache *table_cache,
                   Iterator *iter,FileMetaData *meta)

{
  bool bVar1;
  uint uVar2;
  int iVar3;
  TableBuilder *this_00;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  uint64_t uVar4;
  Status local_100;
  Status local_f8;
  Status local_f0;
  Status local_e8;
  ReadOptions local_e0;
  Iterator *local_d0;
  Iterator *it;
  Status local_c0;
  TableBuilder local_b8;
  Slice local_b0;
  undefined1 local_a0 [8];
  Slice key;
  TableBuilder *builder;
  Status local_70;
  WritableFile *local_68;
  WritableFile *file;
  string fname;
  Iterator *iter_local;
  TableCache *table_cache_local;
  Options *options_local;
  Env *env_local;
  string *dbname_local;
  Status *s;
  
  fname.field_2._M_local_buf[0xf] = '\0';
  Status::Status((Status *)this);
  meta->file_size = 0;
  (*iter->_vptr_Iterator[3])();
  TableFileName((string *)&file,dbname,meta->number);
  uVar2 = (*iter->_vptr_Iterator[2])();
  if ((uVar2 & 1) != 0) {
    (*env->_vptr_Env[4])(&local_70,env,&file,&local_68);
    Status::operator=((Status *)this,&local_70);
    Status::~Status(&local_70);
    bVar1 = Status::ok((Status *)this);
    if (!bVar1) goto LAB_0014193d;
    this_00 = (TableBuilder *)operator_new(8);
    TableBuilder::TableBuilder(this_00,options,local_68);
    iVar3 = (*iter->_vptr_Iterator[8])();
    key.size_ = CONCAT44(extraout_var,iVar3);
    InternalKey::DecodeFrom(&meta->smallest,(Slice *)&key.size_);
    while (uVar2 = (*iter->_vptr_Iterator[2])(), (uVar2 & 1) != 0) {
      iVar3 = (*iter->_vptr_Iterator[8])();
      local_a0 = (undefined1  [8])CONCAT44(extraout_var_00,iVar3);
      InternalKey::DecodeFrom(&meta->largest,(Slice *)local_a0);
      iVar3 = (*iter->_vptr_Iterator[9])();
      local_b0.data_ = (char *)CONCAT44(extraout_var_01,iVar3);
      TableBuilder::Add(this_00,(Slice *)local_a0,&local_b0);
      (*iter->_vptr_Iterator[6])();
    }
    TableBuilder::Finish(&local_b8);
    Status::operator=((Status *)this,(Status *)&local_b8);
    Status::~Status((Status *)&local_b8);
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      uVar4 = TableBuilder::FileSize(this_00);
      meta->file_size = uVar4;
      if (meta->file_size == 0) {
        __assert_fail("meta->file_size > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/walterzhaoJR[P]leveldb/db/builder.cc"
                      ,0x2b,
                      "Status leveldb::BuildTable(const std::string &, Env *, const Options &, TableCache *, Iterator *, FileMetaData *)"
                     );
      }
    }
    if (this_00 != (TableBuilder *)0x0) {
      TableBuilder::~TableBuilder(this_00);
      operator_delete(this_00);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (*local_68->_vptr_WritableFile[5])(&local_c0);
      Status::operator=((Status *)this,&local_c0);
      Status::~Status(&local_c0);
    }
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      (*local_68->_vptr_WritableFile[3])(&it);
      Status::operator=((Status *)this,(Status *)&it);
      Status::~Status((Status *)&it);
    }
    if (local_68 != (WritableFile *)0x0) {
      (*local_68->_vptr_WritableFile[1])();
    }
    local_68 = (WritableFile *)0x0;
    bVar1 = Status::ok((Status *)this);
    if (bVar1) {
      memset(&local_e0,0,0x10);
      ReadOptions::ReadOptions(&local_e0);
      local_d0 = TableCache::NewIterator
                           (table_cache,&local_e0,meta->number,meta->file_size,(Table **)0x0);
      (*local_d0->_vptr_Iterator[10])(&local_e8);
      Status::operator=((Status *)this,&local_e8);
      Status::~Status(&local_e8);
      if (local_d0 != (Iterator *)0x0) {
        (*local_d0->_vptr_Iterator[1])();
      }
    }
  }
  (*iter->_vptr_Iterator[10])(&local_f0);
  bVar1 = Status::ok(&local_f0);
  Status::~Status(&local_f0);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    (*iter->_vptr_Iterator[10])(&local_f8);
    Status::operator=((Status *)this,&local_f8);
    Status::~Status(&local_f8);
  }
  bVar1 = Status::ok((Status *)this);
  if ((!bVar1) || (meta->file_size == 0)) {
    (*env->_vptr_Env[8])(&local_100,env,&file);
    Status::~Status(&local_100);
  }
LAB_0014193d:
  fname.field_2._M_local_buf[0xf] = '\x01';
  std::__cxx11::string::~string((string *)&file);
  if ((fname.field_2._M_local_buf[0xf] & 1U) == 0) {
    Status::~Status((Status *)this);
  }
  return (Status)(char *)this;
}

Assistant:

Status BuildTable(const std::string& dbname, Env* env, const Options& options,
                  TableCache* table_cache, Iterator* iter, FileMetaData* meta) {
  Status s;
  meta->file_size = 0;
  iter->SeekToFirst();

  std::string fname = TableFileName(dbname, meta->number);
  if (iter->Valid()) {
    WritableFile* file;
    s = env->NewWritableFile(fname, &file);
    if (!s.ok()) {
      return s;
    }

    TableBuilder* builder = new TableBuilder(options, file);
    meta->smallest.DecodeFrom(iter->key());
    for (; iter->Valid(); iter->Next()) {
      Slice key = iter->key();
      meta->largest.DecodeFrom(key);
      builder->Add(key, iter->value());
    }

    // Finish and check for builder errors
    s = builder->Finish();
    if (s.ok()) {
      meta->file_size = builder->FileSize();
      assert(meta->file_size > 0);
    }
    delete builder;

    // Finish and check for file errors
    if (s.ok()) {
      s = file->Sync();
    }
    if (s.ok()) {
      s = file->Close();
    }
    delete file;
    file = nullptr;

    if (s.ok()) {
      // Verify that the table is usable
      Iterator* it = table_cache->NewIterator(ReadOptions(), meta->number,
                                              meta->file_size);
      s = it->status();
      delete it;
    }
  }

  // Check for input iterator errors
  if (!iter->status().ok()) {
    s = iter->status();
  }

  if (s.ok() && meta->file_size > 0) {
    // Keep it
  } else {
    env->RemoveFile(fname);
  }
  return s;
}